

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O0

int init_finfo(void)

{
  int *piVar1;
  int local_1c;
  finfo *pfStack_18;
  int n;
  FINFO *cp;
  
  FreeFinfoList = (FINFO *)calloc(0x340,0x400);
  if (FreeFinfoList == (FINFO *)0x0) {
    piVar1 = __errno_location();
    *Lisp_errno = *piVar1;
    cp._4_4_ = 0;
  }
  else {
    pfStack_18 = FreeFinfoList;
    for (local_1c = 0x400; 1 < local_1c; local_1c = local_1c + -1) {
      pfStack_18->prop = (FPROP *)(pfStack_18 + 1);
      pfStack_18->next = (finfo *)(pfStack_18[1].no_ver_name + 0x10);
      pfStack_18 = pfStack_18->next;
    }
    pfStack_18->prop = (FPROP *)(pfStack_18 + 1);
    pfStack_18->next = (finfo *)0x0;
    FinfoArray = (DFINFO *)calloc(0x10,0x20);
    if (FinfoArray == (DFINFO *)0x0) {
      piVar1 = __errno_location();
      *Lisp_errno = *piVar1;
      cp._4_4_ = 0;
    }
    else {
      MAXFINFO = 0x20;
      cp._4_4_ = 1;
    }
  }
  return cp._4_4_;
}

Assistant:

int init_finfo(void) {
  FINFO *cp;
  int n;

  if ((FreeFinfoList = (FINFO *)calloc(sizeof(FINFO) + sizeof(FPROP), INITFINFONUM)) ==
      (FINFO *)NULL) {
    *Lisp_errno = errno;
    return (0);
  }
  for (cp = FreeFinfoList, n = INITFINFONUM; n > 1; n--) {
    cp->prop = (FPROP *)(cp + 1);
    cp->next = (FINFO *)((char *)cp + sizeof(FINFO) + sizeof(FPROP));
    cp = cp->next;
  }
  cp->prop = (FPROP *)(cp + 1);
  cp->next = (FINFO *)NULL;

  if ((FinfoArray = (DFINFO *)calloc(sizeof(DFINFO), INITFINFOARRAY)) == (DFINFO *)NULL) {
    *Lisp_errno = errno;
    return (0);
  }
  MAXFINFO = INITFINFOARRAY;

  return (1);
}